

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int intrinsic_possible(int type,permonst *ptr)

{
  bool local_21;
  permonst *ptr_local;
  int type_local;
  
  switch(type) {
  case 1:
    ptr_local._4_4_ = ptr->mconveys & 1;
    break;
  case 2:
    ptr_local._4_4_ = ptr->mconveys & 2;
    break;
  case 3:
    ptr_local._4_4_ = ptr->mconveys & 4;
    break;
  case 4:
    ptr_local._4_4_ = ptr->mconveys & 8;
    break;
  case 5:
    ptr_local._4_4_ = ptr->mconveys & 0x10;
    break;
  case 6:
    ptr_local._4_4_ = ptr->mconveys & 0x20;
    break;
  default:
    ptr_local._4_4_ = 0;
    break;
  case 0xe:
    ptr_local._4_4_ = (uint)((ptr->mflags1 & 0x2000000) != 0);
    break;
  case 0xf:
    ptr_local._4_4_ = (uint)((ptr->mflags1 & 0x4000000) != 0);
    break;
  case 0x19:
    local_21 = true;
    if ((ptr != mons + 0x1e) && (local_21 = true, ptr != mons + 0x31)) {
      local_21 = ptr == mons + 0x32;
    }
    ptr_local._4_4_ = (uint)local_21;
  }
  return ptr_local._4_4_;
}

Assistant:

static int intrinsic_possible(int type, const struct permonst *ptr)
{
	switch (type) {
	    case FIRE_RES:
		return ptr->mconveys & MR_FIRE;

	    case SLEEP_RES:
		return ptr->mconveys & MR_SLEEP;

	    case COLD_RES:
		return ptr->mconveys & MR_COLD;

	    case DISINT_RES:
		return ptr->mconveys & MR_DISINT;

	    case SHOCK_RES:	/* shock (electricity) resistance */
		return ptr->mconveys & MR_ELEC;

	    case POISON_RES:
		return ptr->mconveys & MR_POISON;

	    case TELEPORT:
		return can_teleport(ptr);

	    case TELEPORT_CONTROL:
		return control_teleport(ptr);

	    case TELEPAT:
		return telepathic(ptr);

	    default:
		return FALSE;
	}
	/*NOTREACHED*/
}